

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

void __thiscall
t_perl_generator::generate_serialize_field
          (t_perl_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  t_struct *tstruct;
  char *pcVar6;
  t_base_type *this_00;
  undefined1 auVar7 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&name,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 == '\0')) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar3 == '\0')) {
        pcVar1 = (prefix->_M_dataplus)._M_p;
        pcVar2 = (tfield->name_)._M_dataplus._M_p;
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
        printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
               *(undefined8 *)CONCAT44(extraout_var,iVar3));
        return;
      }
      std::__cxx11::string::string((string *)&name,(string *)&tfield->name_);
      if (prefix->_M_string_length != 0) {
        std::operator+(&local_b0,prefix,"{");
        std::operator+(&local_90,&local_b0,&tfield->name_);
        std::operator+(&local_d0,&local_90,"}");
        std::__cxx11::string::operator=((string *)&name,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar4,"$xfer += $output->");
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar3 != '\0') {
          poVar4 = std::operator<<(out,"writeI32($");
          poVar4 = std::operator<<(poVar4,(string *)&name);
          std::operator<<(poVar4,");");
        }
      }
      else {
        this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
        switch(this_00) {
        case (t_base_type *)0x0:
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&name);
          __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case (t_base_type *)0x1:
          pcVar6 = "writeString($";
          break;
        case (t_base_type *)0x2:
          pcVar6 = "writeBool($";
          break;
        case (t_base_type *)0x3:
          pcVar6 = "writeByte($";
          break;
        case (t_base_type *)0x4:
          pcVar6 = "writeI16($";
          break;
        case (t_base_type *)0x5:
          pcVar6 = "writeI32($";
          break;
        case (t_base_type *)0x6:
          pcVar6 = "writeI64($";
          break;
        case (t_base_type *)0x7:
          pcVar6 = "writeDouble($";
          break;
        default:
          auVar7 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_d0,this_00,auVar7._8_4_);
          std::operator+(auVar7._0_8_,"compiler error: no PERL name for base type ",&local_d0);
          __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        poVar4 = std::operator<<(out,pcVar6);
        poVar4 = std::operator<<(poVar4,(string *)&name);
        std::operator<<(poVar4,");");
      }
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      pbVar5 = &name;
      goto LAB_00267ec3;
    }
    std::operator+(&local_d0,prefix,"{");
    std::operator+(&name,&local_d0,&tfield->name_);
    std::operator+(&local_70,&name,"}");
    generate_serialize_container(this,out,ttype,&local_70);
    pbVar5 = &local_70;
  }
  else {
    std::operator+(&local_d0,prefix,"{");
    std::operator+(&name,&local_d0,&tfield->name_);
    std::operator+(&local_50,&name,"}");
    generate_serialize_struct(this,out,tstruct,&local_50);
    pbVar5 = &local_50;
  }
  std::__cxx11::string::~string((string *)pbVar5);
  std::__cxx11::string::~string((string *)&name);
  pbVar5 = &local_d0;
LAB_00267ec3:
  std::__cxx11::string::~string((string *)pbVar5);
  return;
}

Assistant:

void t_perl_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + "{" + tfield->get_name() + "}");
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + "{" + tfield->get_name() + "}");
  } else if (type->is_base_type() || type->is_enum()) {

    string name = tfield->get_name();

    // Hack for when prefix is defined (always a hash ref)
    if (!prefix.empty())
      name = prefix + "{" + tfield->get_name() + "}";

    indent(out) << "$xfer += $output->";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        out << "writeString($" << name << ");";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool($" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte($" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16($" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32($" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64($" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble($" << name << ");";
        break;
      default:
        throw "compiler error: no PERL name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32($" << name << ");";
    }
    out << endl;

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}